

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanBlockScalar(Scanner *this,bool IsLiteral)

{
  bool bVar1;
  uint uVar2;
  byte bVar3;
  char *in_start;
  uint uVar4;
  uint BlockIndent_00;
  bool IsDone;
  char ChompingIndicator;
  uint BlockIndent;
  uint local_1b4;
  iterator local_1b0;
  StringRef local_1a8;
  undefined1 local_198 [24];
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  string local_160;
  SmallString<256U> Str;
  
  if ((*this->Current != '>') && (*this->Current != '|')) {
    __assert_fail("*Current == \'|\' || *Current == \'>\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                  ,0x62c,"bool llvm::yaml::Scanner::scanBlockScalar(bool)");
  }
  skip(this,1);
  IsDone = false;
  bVar1 = scanBlockScalarHeader(this,&ChompingIndicator,&BlockIndent,&IsDone);
  if (bVar1) {
    if (IsDone != false) {
      return true;
    }
    uVar2 = this->Indent;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    local_1b0 = this->Current;
    local_1b4 = 0;
    BlockIndent_00 = BlockIndent;
    if ((BlockIndent != 0) ||
       (bVar1 = findBlockScalarIndent(this,&BlockIndent,uVar2,&local_1b4,&IsDone),
       BlockIndent_00 = BlockIndent, bVar1)) {
      Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX =
           &Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>;
      Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size = 0;
      Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity = 0x100;
      bVar3 = IsDone;
      uVar4 = local_1b4;
      while ((bVar3 & 1) == 0) {
        bVar1 = scanBlockScalarIndent(this,BlockIndent_00,uVar2,&IsDone);
        if (!bVar1) {
          bVar1 = false;
          goto LAB_00174885;
        }
        if (IsDone != false) break;
        in_start = this->Current;
        advanceWhile(this,0x172f54);
        if (in_start != this->Current) {
          SmallString<256U>::append(&Str,(ulong)uVar4,'\n');
          SmallVectorImpl<char>::append<char_const*,void>
                    ((SmallVectorImpl<char> *)&Str,in_start,this->Current);
          in_start = this->Current;
          uVar4 = 0;
        }
        if ((in_start == this->End) || (bVar1 = consumeLineBreakIfPresent(this), !bVar1)) break;
        uVar4 = uVar4 + 1;
        bVar3 = 0;
      }
      if (ChompingIndicator == '-') {
        uVar2 = 0;
      }
      else if (ChompingIndicator == '+') {
        uVar2 = 1;
        if (uVar4 != 0) {
          uVar2 = uVar4;
        }
        if (this->Current != this->End) {
          uVar2 = uVar4;
        }
      }
      else {
        uVar2 = (uint)(Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                       super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size != 0);
      }
      SmallString<256U>::append(&Str,(ulong)uVar2,'\n');
      if (this->FlowLevel == 0) {
        this->IsSimpleKeyAllowed = true;
      }
      local_180._M_p = (pointer)&local_170;
      local_178 = 0;
      local_170._M_local_buf[0] = '\0';
      local_198._0_4_ = TK_BlockScalar;
      local_198._16_8_ = (long)this->Current - (long)local_1b0;
      local_198._8_8_ = local_1b0;
      local_1a8.Length =
           Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
           super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
           super_SmallVectorBase._8_8_ & 0xffffffff;
      local_1a8.Data =
           (char *)Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                   super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      StringRef::str_abi_cxx11_(&local_160,&local_1a8);
      std::__cxx11::string::operator=((string *)&local_180,(string *)&local_160);
      std::__cxx11::string::_M_dispose();
      AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
      ::push_back(&this->TokenQueue,(Token *)local_198);
      std::__cxx11::string::_M_dispose();
      bVar1 = true;
LAB_00174885:
      SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&Str);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Scanner::scanBlockScalar(bool IsLiteral) {
  // Eat '|' or '>'
  assert(*Current == '|' || *Current == '>');
  skip(1);

  char ChompingIndicator;
  unsigned BlockIndent;
  bool IsDone = false;
  if (!scanBlockScalarHeader(ChompingIndicator, BlockIndent, IsDone))
    return false;
  if (IsDone)
    return true;

  auto Start = Current;
  unsigned BlockExitIndent = Indent < 0 ? 0 : (unsigned)Indent;
  unsigned LineBreaks = 0;
  if (BlockIndent == 0) {
    if (!findBlockScalarIndent(BlockIndent, BlockExitIndent, LineBreaks,
                               IsDone))
      return false;
  }

  // Scan the block's scalars body.
  SmallString<256> Str;
  while (!IsDone) {
    if (!scanBlockScalarIndent(BlockIndent, BlockExitIndent, IsDone))
      return false;
    if (IsDone)
      break;

    // Parse the current line.
    auto LineStart = Current;
    advanceWhile(&Scanner::skip_nb_char);
    if (LineStart != Current) {
      Str.append(LineBreaks, '\n');
      Str.append(StringRef(LineStart, Current - LineStart));
      LineBreaks = 0;
    }

    // Check for EOF.
    if (Current == End)
      break;

    if (!consumeLineBreakIfPresent())
      break;
    ++LineBreaks;
  }

  if (Current == End && !LineBreaks)
    // Ensure that there is at least one line break before the end of file.
    LineBreaks = 1;
  Str.append(getChompedLineBreaks(ChompingIndicator, LineBreaks, Str), '\n');

  // New lines may start a simple key.
  if (!FlowLevel)
    IsSimpleKeyAllowed = true;

  Token T;
  T.Kind = Token::TK_BlockScalar;
  T.Range = StringRef(Start, Current - Start);
  T.Value = Str.str().str();
  TokenQueue.push_back(T);
  return true;
}